

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O2

bool MessageSign(CKey *privkey,string *message,string *signature)

{
  bool bVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature_bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MessageHash((uint256 *)&local_40,message);
  bVar1 = CKey::SignCompact(privkey,(uint256 *)&local_40,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  if (bVar1) {
    input.m_size = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58._M_impl.super__Vector_impl_data._M_start;
    input.m_data = local_58._M_impl.super__Vector_impl_data._M_start;
    EncodeBase64_abi_cxx11_(&local_40,input);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (signature,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool MessageSign(
    const CKey& privkey,
    const std::string& message,
    std::string& signature)
{
    std::vector<unsigned char> signature_bytes;

    if (!privkey.SignCompact(MessageHash(message), signature_bytes)) {
        return false;
    }

    signature = EncodeBase64(signature_bytes);

    return true;
}